

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O2

int xz_decomp(xz_statep state)

{
  size_t sVar1;
  uint8_t *puVar2;
  int iVar3;
  uint err;
  size_t sVar4;
  uLong uVar5;
  ulong uVar6;
  char *msg;
  undefined8 uVar7;
  unsigned_long len;
  unsigned_long crc;
  
  sVar1 = (state->strm).avail_out;
  uVar7 = 0;
  do {
    sVar4 = (state->strm).avail_in;
    if (sVar4 == 0) {
      iVar3 = xz_avail(state);
      if (iVar3 == -1) goto LAB_001db1d2;
      sVar4 = (state->strm).avail_in;
      if (sVar4 == 0) goto LAB_001db18b;
    }
    if (state->eof != 0) {
      uVar7 = 3;
    }
    if (state->how == 2) {
      (state->zstrm).avail_in = (uInt)sVar4;
      puVar2 = (state->strm).next_out;
      (state->zstrm).next_in = (state->strm).next_in;
      (state->zstrm).avail_out = (uInt)(state->strm).avail_out;
      (state->zstrm).next_out = puVar2;
      err = inflate(&state->zstrm,0);
      if ((err != 2) && (err != 0xfffffffe)) {
        if (err == 0xfffffffc) {
          err = 5;
        }
        (state->strm).avail_in = (ulong)(state->zstrm).avail_in;
        (state->strm).next_in = (state->zstrm).next_in;
        (state->strm).avail_out = (ulong)(state->zstrm).avail_out;
        (state->strm).next_out = (state->zstrm).next_out;
        if (err != 0xfffffffd) goto LAB_001db07b;
LAB_001db153:
        msg = "compressed data error";
        goto LAB_001db1c7;
      }
      msg = "internal error: inflate stream corrupt";
      err = 0xfffffffe;
      goto LAB_001db1cd;
    }
    err = lzma_code(&state->strm,uVar7);
LAB_001db07b:
    if (err == 0xb) {
      msg = "compression error";
      err = 0xb;
      goto LAB_001db1cd;
    }
    if (err == 9) goto LAB_001db153;
    if (err == 5) {
      msg = "out of memory";
      err = 5;
      goto LAB_001db1cd;
    }
    if ((1 < err) && (state->how != 2)) {
      msg = "lzma error";
      goto LAB_001db1cd;
    }
    sVar4 = (state->strm).avail_out;
  } while ((err != 1) && (sVar4 != 0));
  uVar6 = sVar1 - sVar4;
  state->have = (uint)uVar6;
  uVar5 = (state->zstrm).adler;
  state->next = (state->strm).next_out + -(uVar6 & 0xffffffff);
  uVar5 = crc32(uVar5);
  (state->zstrm).adler = uVar5;
  if (err == 1) {
    if (state->how == 2) {
      iVar3 = gz_next4(state,&crc);
      if ((iVar3 == -1) || (iVar3 = gz_next4(state,&len), iVar3 == -1)) {
LAB_001db18b:
        msg = "unexpected end of file";
      }
      else if (crc == (state->zstrm).adler) {
        if (len == (uint)(state->zstrm).total_out) {
          (state->strm).next_in = (uint8_t *)0x0;
          (state->strm).avail_in = 0;
          (state->strm).next_out = (uint8_t *)0x0;
          (state->strm).avail_out = 0;
          goto LAB_001db1ae;
        }
        msg = "incorrect length check";
      }
      else {
        msg = "incorrect data check";
      }
    }
    else {
      if (((state->strm).avail_in == 0) && (state->eof != 0)) {
LAB_001db1ae:
        state->how = 0;
        goto LAB_001db1b3;
      }
      msg = "trailing garbage";
    }
LAB_001db1c7:
    err = 9;
LAB_001db1cd:
    xz_error(state,err,msg);
LAB_001db1d2:
    iVar3 = -1;
  }
  else {
LAB_001db1b3:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xz_decomp(xz_statep state)
{
    int ret;
    unsigned had;
    unsigned long crc, len;
    lzma_stream *strm = &(state->strm);

    lzma_action action = LZMA_RUN;

    /* Avoid unused variable warning if features are disabled. */
    (void) crc;
    (void) len;

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && xz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            xz_error(state, LZMA_DATA_ERROR, "unexpected end of file");
            return -1;
        }
        if (state->eof)
            action = LZMA_FINISH;

        /* decompress and handle errors */
#ifdef LIBXML_ZLIB_ENABLED
        if (state->how == GZIP) {
            state->zstrm.avail_in = (uInt) state->strm.avail_in;
            state->zstrm.next_in = (Bytef *) state->strm.next_in;
            state->zstrm.avail_out = (uInt) state->strm.avail_out;
            state->zstrm.next_out = (Bytef *) state->strm.next_out;
            ret = inflate(&state->zstrm, Z_NO_FLUSH);
            if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
                xz_error(state, Z_STREAM_ERROR,
                         "internal error: inflate stream corrupt");
                return -1;
            }
            /*
             * FIXME: Remapping a couple of error codes and falling through
             * to the LZMA error handling looks fragile.
             */
            if (ret == Z_MEM_ERROR)
                ret = LZMA_MEM_ERROR;
            if (ret == Z_DATA_ERROR)
                ret = LZMA_DATA_ERROR;
            if (ret == Z_STREAM_END)
                ret = LZMA_STREAM_END;
            state->strm.avail_in = state->zstrm.avail_in;
            state->strm.next_in = state->zstrm.next_in;
            state->strm.avail_out = state->zstrm.avail_out;
            state->strm.next_out = state->zstrm.next_out;
        } else                  /* state->how == LZMA */
#endif
            ret = lzma_code(strm, action);
        if (ret == LZMA_MEM_ERROR) {
            xz_error(state, LZMA_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == LZMA_DATA_ERROR) {
            xz_error(state, LZMA_DATA_ERROR, "compressed data error");
            return -1;
        }
        if (ret == LZMA_PROG_ERROR) {
            xz_error(state, LZMA_PROG_ERROR, "compression error");
            return -1;
        }
        if ((state->how != GZIP) &&
            (ret != LZMA_OK) && (ret != LZMA_STREAM_END)) {
            xz_error(state, ret, "lzma error");
            return -1;
        }
    } while (strm->avail_out && ret != LZMA_STREAM_END);

    /* update available output and crc check value */
    state->have = had - strm->avail_out;
    state->next = strm->next_out - state->have;
#ifdef LIBXML_ZLIB_ENABLED
    state->zstrm.adler =
        crc32(state->zstrm.adler, state->next, state->have);
#endif

    if (ret == LZMA_STREAM_END) {
#ifdef LIBXML_ZLIB_ENABLED
        if (state->how == GZIP) {
            if (gz_next4(state, &crc) == -1 || gz_next4(state, &len) == -1) {
                xz_error(state, LZMA_DATA_ERROR, "unexpected end of file");
                return -1;
            }
            if (crc != state->zstrm.adler) {
                xz_error(state, LZMA_DATA_ERROR, "incorrect data check");
                return -1;
            }
            if (len != (state->zstrm.total_out & 0xffffffffL)) {
                xz_error(state, LZMA_DATA_ERROR, "incorrect length check");
                return -1;
            }
            state->strm.avail_in = 0;
            state->strm.next_in = NULL;
            state->strm.avail_out = 0;
            state->strm.next_out = NULL;
        } else
#endif
        if (strm->avail_in != 0 || !state->eof) {
            xz_error(state, LZMA_DATA_ERROR, "trailing garbage");
            return -1;
        }
        state->how = LOOK;      /* ready for next stream, once have is 0 (leave
                                 * state->direct unchanged to remember how) */
    }

    /* good decompression */
    return 0;
}